

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-player.c
# Opt level: O2

wchar_t project_player_handler_SOUND(project_player_handler_context_t *context)

{
  player *p;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  long lVar4;
  player_state_conflict *ppVar5;
  undefined1 *puVar6;
  player_state_conflict in_stack_fffffffffffffea8;
  
  ppVar5 = &player->state;
  puVar6 = &stack0xfffffffffffffea8;
  for (lVar4 = 0x13c; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = (char)ppVar5->stat_add[0];
    ppVar5 = (player_state_conflict *)((long)ppVar5->stat_add + 1);
    puVar6 = puVar6 + 1;
  }
  _Var1 = player_resists_effects(in_stack_fffffffffffffea8,L'\a');
  if (_Var1) {
    msg("You resist the effect!");
  }
  else {
    _Var1 = player_of_has(player,L'\t');
    if (_Var1) {
      equip_learn_flag(player,L'\t');
    }
    else {
      uVar2 = Rand_div(context->dam / 3);
      uVar3 = 0x1d;
      if ((int)uVar2 < 0x1d) {
        uVar3 = uVar2;
      }
      player_inc_timed(player,L'\t',uVar3 + L'\x06',true,true,true);
    }
    if (L'Ĭ' < context->dam) {
      _Var1 = player_inc_check(player,L'\x04',false);
      if (_Var1) {
        msg("The noise disorients you.");
      }
      p = player;
      uVar3 = Rand_div(context->dam / 100);
      player_inc_timed(p,L'\x04',uVar3 + L'\x03',true,true,true);
    }
  }
  return L'\0';
}

Assistant:

static int project_player_handler_SOUND(project_player_handler_context_t *context)
{
	if (player_resists_effects(player->state, ELEM_SOUND)) {
		msg("You resist the effect!");
		return 0;
	}

	/* Stun */
	if (!player_of_has(player, OF_PROT_STUN)) {
		int duration = 5 + randint1(context->dam / 3);
		if (duration > 35) duration = 35;
		(void)player_inc_timed(player, TMD_STUN, duration, true, true,
			true);
	} else {
		equip_learn_flag(player, OF_PROT_STUN);
	}

	/* Confusion for strong unresisted sound */
	if (context->dam > 300) {
		/* Check for resistance before issuing a message. */
		if (player_inc_check(player, TMD_CONFUSED, false)) {
			msg("The noise disorients you.");
		}
		(void)player_inc_timed(player, TMD_CONFUSED,
			2 + randint1(context->dam / 100), true, true, true);
	}
	return 0;
}